

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O1

void __thiscall CCIT<TTA>::PerformLabeling(CCIT<TTA> *this)

{
  char cVar1;
  int *piVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  bool bVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  undefined4 uVar30;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  uint *puVar37;
  long lVar38;
  char *pcVar39;
  long lVar40;
  ulong in_R11;
  uint uVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  uint *img_labels_row_prev_prev;
  uchar *img_row_fol;
  uchar *img_row;
  uint local_128;
  ulong local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong uVar31;
  
  piVar2 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar2,piVar2[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar32 = *(int *)&pMVar4->field_0xc;
  lVar43 = (long)iVar32;
  uVar17 = *(uint *)&pMVar4->field_0x8;
  uVar29 = (ulong)uVar17;
  iVar23 = *(int *)&pMVar3->field_0x8;
  iVar14 = *(int *)&pMVar3->field_0xc;
  TTA::Alloc(((iVar14 - (iVar14 + 1 >> 0x1f)) + 1 >> 1) * ((iVar23 - (iVar23 + 1 >> 0x1f)) + 1 >> 1)
             + 1);
  puVar7 = TTA::rtable_;
  *TTA::rtable_ = 0;
  puVar10 = TTA::tail_;
  puVar8 = TTA::next_;
  TTA::length_ = 1;
  if (0 < lVar43) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar28 = *(long *)&pMVar3->field_0x10;
    lVar35 = **(long **)&pMVar3->field_0x48;
    lVar44 = lVar28 + lVar35;
    lVar5 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    iVar23 = 0;
    do {
      lVar36 = (long)iVar23;
      if (*(char *)(lVar28 + lVar36) == '\0') {
        lVar25 = lVar36 + 1;
        iVar14 = (int)lVar25;
        if ((iVar14 < iVar32) && (*(char *)(lVar28 + lVar25) != '\0')) {
LAB_001d39cb:
          puVar7[TTA::length_] = TTA::length_;
          puVar8[TTA::length_] = 0xffffffff;
          puVar10[TTA::length_] = TTA::length_;
          in_R11 = (ulong)TTA::length_;
          uVar12 = TTA::length_ + 1;
          *(uint *)(lVar5 + lVar36 * 4) = TTA::length_;
          TTA::length_ = uVar12;
          bVar6 = true;
          goto LAB_001d3a0e;
        }
        if (((int)uVar17 < 2) || (*(char *)(lVar44 + lVar36) == '\0')) {
          bVar6 = false;
          if (((int)uVar17 < 2) || (iVar32 <= iVar14)) goto LAB_001d3a0e;
          if (*(char *)(lVar44 + lVar25) != '\0') goto LAB_001d39cb;
        }
        else {
          puVar7[TTA::length_] = TTA::length_;
          puVar8[TTA::length_] = 0xffffffff;
          puVar10[TTA::length_] = TTA::length_;
          in_R11 = (ulong)TTA::length_;
          uVar12 = TTA::length_ + 1;
          *(uint *)(lVar5 + lVar36 * 4) = TTA::length_;
          TTA::length_ = uVar12;
          if (iVar14 < iVar32) {
            cVar1 = *(char *)(lVar44 + lVar25);
            goto joined_r0x001d39b1;
          }
        }
LAB_001d3a0b:
        bVar6 = false;
      }
      else {
        puVar7[TTA::length_] = TTA::length_;
        puVar8[TTA::length_] = 0xffffffff;
        puVar10[TTA::length_] = TTA::length_;
        in_R11 = (ulong)TTA::length_;
        uVar12 = TTA::length_ + 1;
        *(uint *)(lVar5 + lVar36 * 4) = TTA::length_;
        TTA::length_ = uVar12;
        lVar36 = lVar36 + 1;
        if (iVar32 <= (int)lVar36) goto LAB_001d3a0b;
        bVar6 = true;
        if (*(char *)(lVar28 + lVar36) == '\0') {
          if (1 < (int)uVar17) {
            cVar1 = *(char *)(lVar44 + lVar36);
joined_r0x001d39b1:
            bVar6 = true;
            if (cVar1 != '\0') goto LAB_001d3a0e;
          }
          goto LAB_001d3a0b;
        }
      }
LAB_001d3a0e:
      puVar11 = TTA::tail_;
      puVar9 = TTA::next_;
      iVar14 = iVar23 + 2;
      if ((bVar6) && (iVar14 < iVar32)) {
        lVar36 = (long)iVar14;
        pcVar39 = (char *)(lVar28 + lVar36);
        puVar37 = (uint *)(lVar5 + lVar36 * 4);
        iVar23 = iVar23 + 3;
        do {
          iVar14 = iVar23;
          lVar36 = lVar36 + 2;
          uVar12 = (uint)in_R11;
          if (*pcVar39 == '\0') {
            if ((iVar14 < iVar32) && (*(char *)(lVar28 + iVar14) != '\0')) {
              if (((int)uVar17 < 2) || (pcVar39[lVar35] == '\0')) {
LAB_001d3add:
                puVar7[TTA::length_] = TTA::length_;
                puVar9[TTA::length_] = 0xffffffff;
                puVar11[TTA::length_] = TTA::length_;
                in_R11 = (ulong)TTA::length_;
                uVar12 = TTA::length_ + 1;
                *puVar37 = TTA::length_;
                TTA::length_ = uVar12;
              }
              else {
                *puVar37 = uVar12;
              }
              bVar6 = true;
              goto LAB_001d3b16;
            }
            if (((int)uVar17 < 2) || (pcVar39[lVar35] == '\0')) {
              bVar6 = false;
              if (((int)uVar17 < 2) || (iVar32 <= iVar14)) goto LAB_001d3b16;
              if (*(char *)(lVar44 + iVar14) != '\0') goto LAB_001d3add;
            }
            else {
              *puVar37 = uVar12;
              if (iVar14 < iVar32) goto LAB_001d3abb;
            }
LAB_001d3b13:
            bVar6 = false;
          }
          else {
            *puVar37 = uVar12;
            if (iVar32 <= iVar14) goto LAB_001d3b13;
            bVar6 = true;
            if (*(char *)(lVar28 + iVar14) == '\0') {
              if (1 < (int)uVar17) {
LAB_001d3abb:
                bVar6 = true;
                if (*(char *)(lVar44 + iVar14) != '\0') goto LAB_001d3b16;
              }
              goto LAB_001d3b13;
            }
          }
LAB_001d3b16:
          if (!bVar6) break;
          pcVar39 = pcVar39 + 2;
          puVar37 = puVar37 + 2;
          iVar23 = iVar14 + 2;
        } while (lVar36 < lVar43);
        iVar14 = iVar14 + 1;
      }
      iVar23 = iVar14;
    } while (iVar23 < iVar32);
  }
  if (2 < (int)uVar17) {
    local_f8 = 2;
    local_e0 = 1;
    local_e8 = 3;
    local_f0 = 0;
    do {
      if (0 < iVar32) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar44 = *(long *)&pMVar3->field_0x10;
        lVar28 = **(long **)&pMVar3->field_0x48;
        lVar36 = lVar28 * local_f8 + lVar44;
        lVar38 = lVar36 - lVar28;
        lVar25 = lVar36 + lVar28;
        lVar35 = *(long *)&pMVar4->field_0x10;
        lVar5 = **(long **)&pMVar4->field_0x48;
        lVar42 = lVar5 * local_f8 + lVar35;
        lVar40 = lVar42 + lVar5 * -2;
        uVar33 = local_f8 | 1;
        uVar34 = 0;
        do {
          iVar23 = (int)uVar34;
          uVar18 = (ulong)iVar23;
          uVar22 = uVar18 + 1;
          iVar14 = (int)uVar22;
          if (*(char *)(lVar36 + uVar18) == '\0') {
            if ((iVar32 <= iVar14) || (*(char *)(lVar36 + uVar22) == '\0')) {
              if ((uVar33 < uVar29) && (*(char *)(lVar25 + uVar18) != '\0')) {
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                in_R11 = (ulong)TTA::length_;
                uVar12 = TTA::length_ + 1;
                *(uint *)(lVar42 + uVar18 * 4) = TTA::length_;
                TTA::length_ = uVar12;
                if (iVar32 <= iVar14) goto LAB_001d3e78;
                goto LAB_001d3e6a;
              }
              bVar6 = false;
              if ((uVar29 <= uVar33) || (iVar32 <= iVar14)) goto LAB_001d3e7f;
              if (*(char *)(lVar25 + uVar22) != '\0') {
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar12 = TTA::length_;
                TTA::length_ = TTA::length_ + 1;
                goto LAB_001d3db6;
              }
              goto LAB_001d3e78;
            }
            if (*(char *)(lVar38 + uVar22) == '\0') {
              if (*(char *)(lVar38 + uVar18) != '\0') {
                uVar12 = *(uint *)(lVar40 + uVar18 * 4);
                *(uint *)(lVar42 + uVar18 * 4) = uVar12;
                goto LAB_001d43a9;
              }
LAB_001d43e1:
              if (((int)(uVar18 + 2) < iVar32) && (*(char *)(lVar38 + uVar18 + 2) != '\0')) {
                uVar12 = *(uint *)(lVar40 + 8 + uVar18 * 4);
              }
              else {
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar12 = TTA::length_;
                TTA::length_ = TTA::length_ + 1;
              }
              in_R11 = (ulong)uVar12;
              *(uint *)(lVar42 + uVar18 * 4) = uVar12;
              bVar6 = true;
            }
            else {
              uVar12 = *(uint *)(lVar40 + uVar18 * 4);
LAB_001d3db6:
              in_R11 = (ulong)uVar12;
              *(uint *)(lVar42 + uVar18 * 4) = uVar12;
              bVar6 = true;
            }
          }
          else if ((iVar14 < iVar32) && (*(char *)(lVar36 + uVar22) != '\0')) {
            if (*(char *)(lVar38 + uVar18) == '\0') {
              if (*(char *)(lVar38 + uVar22) == '\0') {
                if ((iVar23 < 2) || (*(char *)(lVar38 + -1 + uVar18) == '\0')) goto LAB_001d43e1;
                uVar12 = *(uint *)(lVar40 + -8 + uVar18 * 4);
                *(uint *)(lVar42 + uVar18 * 4) = uVar12;
                uVar18 = uVar34;
LAB_001d43a9:
                in_R11 = (ulong)uVar12;
                lVar45 = uVar18 + 2;
                iVar14 = (int)lVar45;
                goto joined_r0x001d43b2;
              }
              uVar12 = *(uint *)(lVar40 + uVar18 * 4);
              in_R11 = (ulong)uVar12;
              *(uint *)(lVar42 + uVar18 * 4) = uVar12;
              bVar6 = true;
              if ((iVar23 < 2) || (*(char *)(lVar38 + -1 + uVar18) == '\0')) goto LAB_001d3e7f;
              uVar12 = *(uint *)(lVar40 + -8 + uVar18 * 4);
            }
            else {
              uVar12 = *(uint *)(lVar40 + uVar18 * 4);
              in_R11 = (ulong)uVar12;
              *(uint *)(lVar42 + uVar18 * 4) = uVar12;
              bVar6 = true;
              if (*(char *)(lVar38 + uVar22) != '\0') goto LAB_001d3e7f;
              lVar45 = uVar18 + 2;
              iVar14 = (int)lVar45;
joined_r0x001d43b2:
              bVar6 = true;
              if ((iVar32 <= iVar14) || (bVar6 = true, *(char *)(lVar38 + lVar45) == '\0'))
              goto LAB_001d3e7f;
              uVar12 = *(uint *)(lVar40 + 8 + uVar18 * 4);
            }
            bVar6 = true;
            TTA::Merge((uint)in_R11,uVar12);
          }
          else {
            if (*(char *)(lVar38 + uVar18) == '\0') {
              if ((iVar23 < 2) || (*(char *)(lVar38 + -1 + uVar18) == '\0')) {
                if ((iVar14 < iVar32) && (*(char *)(lVar38 + uVar22) != '\0')) goto LAB_001d3cae;
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar12 = TTA::length_;
                TTA::length_ = TTA::length_ + 1;
                goto LAB_001d3e55;
              }
              uVar12 = *(uint *)(lVar40 + -8 + uVar18 * 4);
              in_R11 = (ulong)uVar12;
              *(uint *)(lVar42 + uVar18 * 4) = uVar12;
              if ((iVar14 < iVar32) && (*(char *)(lVar38 + (uVar22 & 0xffffffff)) != '\0')) {
                TTA::Merge(uVar12,*(uint *)(lVar40 + uVar18 * 4));
              }
            }
            else {
LAB_001d3cae:
              uVar12 = *(uint *)(lVar40 + uVar18 * 4);
LAB_001d3e55:
              in_R11 = (ulong)uVar12;
              *(uint *)(lVar42 + uVar18 * 4) = uVar12;
            }
            if ((iVar14 < iVar32) && (uVar33 < uVar29)) {
LAB_001d3e6a:
              bVar6 = true;
              if (*(char *)(lVar25 + uVar22) != '\0') goto LAB_001d3e7f;
            }
LAB_001d3e78:
            bVar6 = false;
          }
LAB_001d3e7f:
          uVar12 = iVar23 + 2;
          if ((bVar6) && ((int)uVar12 < iVar32)) {
            lVar26 = (long)(int)uVar12;
            lVar45 = lVar42 + lVar26 * 4;
            lVar19 = lVar28 * local_e0 + lVar44 + lVar26;
            lVar46 = lVar5 * local_f0 + lVar35 + lVar26 * 4;
            lVar20 = lVar28 * local_e8 + lVar44 + lVar26;
            lVar47 = 0;
            do {
              uVar22 = uVar34 + 3 + lVar47;
              iVar16 = (int)uVar22;
              uVar12 = (uint)in_R11;
              iVar14 = (int)lVar47;
              if (*(char *)(lVar36 + lVar26 + lVar47) == '\0') {
                if ((iVar16 < iVar32) && (lVar21 = (long)iVar16, *(char *)(lVar36 + lVar21) != '\0')
                   ) {
                  if ((uVar29 <= uVar33) || (*(char *)(lVar20 + lVar47) == '\0')) {
                    if (*(char *)(lVar38 + lVar21) == '\0') {
                      if (*(char *)(lVar19 + lVar47) != '\0') {
                        uVar12 = *(uint *)(lVar46 + lVar47 * 4);
                        in_R11 = (ulong)uVar12;
                        *(uint *)(lVar45 + lVar47 * 4) = uVar12;
                        goto LAB_001d4215;
                      }
                      iVar14 = iVar23 + iVar14 + 4;
                      if ((iVar32 <= iVar14) || (*(char *)(lVar38 + iVar14) == '\0'))
                      goto LAB_001d406f;
                      in_R11 = (ulong)*(uint *)(lVar40 + (long)iVar14 * 4);
                    }
                    else {
                      in_R11 = (ulong)*(uint *)(lVar46 + lVar47 * 4);
                    }
LAB_001d4128:
                    *(int *)(lVar45 + lVar47 * 4) = (int)in_R11;
                    goto LAB_001d417d;
                  }
                  *(uint *)(lVar45 + lVar47 * 4) = uVar12;
                  if (*(char *)(lVar38 + lVar21) == '\0') {
                    if (*(char *)(lVar19 + lVar47) != '\0') {
                      iVar16 = iVar23 + iVar14 + 4;
                      if ((iVar16 < iVar32) && (*(char *)(lVar38 + iVar16) != '\0')) {
                        uVar15 = TTA::Merge(*(uint *)(lVar46 + lVar47 * 4),
                                            *(uint *)(lVar40 + (long)iVar16 * 4));
                      }
                      else {
                        uVar15 = *(uint *)(lVar46 + lVar47 * 4);
                      }
                      goto LAB_001d42cd;
                    }
                  }
                  else {
                    uVar15 = *(uint *)(lVar46 + lVar47 * 4);
LAB_001d42cd:
                    TTA::Merge(uVar12,uVar15);
                  }
                  iVar14 = iVar23 + iVar14 + 4;
                  if ((iVar14 < iVar32) && (*(char *)(lVar38 + iVar14) != '\0')) {
                    uVar15 = *(uint *)(lVar40 + (long)iVar14 * 4);
                    goto LAB_001d42fd;
                  }
LAB_001d4307:
                  bVar6 = true;
                  goto LAB_001d4180;
                }
                if ((uVar29 <= uVar33) || (*(char *)(lVar20 + lVar47) == '\0')) {
                  bVar6 = false;
                  if ((uVar33 < uVar29) && (iVar16 < iVar32)) {
                    if (*(char *)(lVar25 + iVar16) != '\0') {
LAB_001d406f:
                      TTA::rtable_[TTA::length_] = TTA::length_;
                      TTA::next_[TTA::length_] = 0xffffffff;
                      TTA::tail_[TTA::length_] = TTA::length_;
                      in_R11 = (ulong)TTA::length_;
                      TTA::length_ = TTA::length_ + 1;
                      goto LAB_001d4128;
                    }
                    goto LAB_001d410f;
                  }
                  goto LAB_001d4180;
                }
                *(uint *)(lVar45 + lVar47 * 4) = uVar12;
                if (iVar16 < iVar32) goto LAB_001d3fad;
LAB_001d410f:
                bVar6 = false;
              }
              else {
                uVar18 = uVar34 + lVar47;
                *(uint *)(lVar45 + lVar47 * 4) = uVar12;
                iVar13 = (int)uVar18;
                if ((iVar32 <= iVar16) || (*(char *)(lVar36 + iVar16) == '\0')) {
                  *(uint *)(lVar45 + lVar47 * 4) = uVar12;
                  if (*(char *)(lVar19 + lVar47) == '\0') {
                    if ((-1 < iVar13) &&
                       (uVar18 = uVar18 & 0xffffffff, *(char *)(lVar38 + 1 + uVar18) != '\0')) {
                      if ((iVar16 < iVar32) && (*(char *)(lVar38 + (uVar22 & 0xffffffff)) != '\0'))
                      {
                        uVar15 = TTA::Merge(*(uint *)(lVar40 + uVar18 * 4),
                                            *(uint *)(lVar46 + lVar47 * 4));
                      }
                      else {
                        uVar15 = *(uint *)(lVar40 + uVar18 * 4);
                      }
                      goto LAB_001d3f84;
                    }
                    if (iVar32 <= iVar16) goto LAB_001d410f;
                    if (*(char *)(lVar38 + iVar16) != '\0') goto LAB_001d3f7b;
                  }
                  else {
LAB_001d3f7b:
                    uVar15 = *(uint *)(lVar46 + lVar47 * 4);
LAB_001d3f84:
                    TTA::Merge(uVar12,uVar15);
                  }
                  if ((iVar16 < iVar32) && (uVar33 < uVar29)) {
LAB_001d3fad:
                    bVar6 = true;
                    if (*(char *)(lVar25 + iVar16) != '\0') goto LAB_001d4180;
                  }
                  goto LAB_001d410f;
                }
                cVar1 = *(char *)(lVar38 + iVar16);
                if (*(char *)(lVar19 + lVar47) == '\0') {
                  if (cVar1 != '\0') {
                    if ((iVar13 < 0) || (*(char *)(lVar38 + 1 + (uVar18 & 0xffffffff)) == '\0'))
                    goto LAB_001d4164;
                    uVar15 = *(uint *)(lVar40 + (uVar18 & 0xffffffff) * 4);
                    uVar24 = *(uint *)(lVar46 + lVar47 * 4);
                    goto LAB_001d4158;
                  }
                  if ((-1 < iVar13) &&
                     (uVar18 = uVar18 & 0xffffffff, *(char *)(lVar38 + 1 + uVar18) != '\0')) {
                    uVar24 = iVar23 + iVar14 + 4;
                    if (((int)uVar24 < iVar32) && (*(char *)(lVar38 + (ulong)uVar24) != '\0')) {
                      uVar15 = *(uint *)(lVar40 + uVar18 * 4);
                      uVar24 = *(uint *)(lVar40 + (ulong)uVar24 * 4);
                      goto LAB_001d4158;
                    }
                    uVar15 = *(uint *)(lVar40 + uVar18 * 4);
                    goto LAB_001d4170;
                  }
LAB_001d4215:
                  uVar12 = (uint)in_R11;
                  iVar14 = iVar23 + iVar14 + 4;
                  bVar6 = true;
                  if ((iVar32 <= iVar14) || (*(char *)(lVar38 + iVar14) == '\0')) goto LAB_001d4180;
                  uVar15 = *(uint *)(lVar40 + (long)iVar14 * 4);
LAB_001d42fd:
                  TTA::Merge(uVar12,uVar15);
                  goto LAB_001d4307;
                }
                if (((cVar1 == '\0') && (iVar14 = iVar23 + iVar14 + 4, iVar14 < iVar32)) &&
                   (*(char *)(lVar38 + iVar14) != '\0')) {
                  uVar15 = *(uint *)(lVar46 + lVar47 * 4);
                  uVar24 = *(uint *)(lVar40 + (long)iVar14 * 4);
LAB_001d4158:
                  uVar15 = TTA::Merge(uVar15,uVar24);
                }
                else {
LAB_001d4164:
                  uVar15 = *(uint *)(lVar46 + lVar47 * 4);
                }
LAB_001d4170:
                TTA::Merge(uVar12,uVar15);
LAB_001d417d:
                bVar6 = true;
              }
LAB_001d4180:
              lVar21 = lVar47 + 2;
            } while ((bVar6) && (lVar27 = lVar26 + lVar47, lVar47 = lVar21, lVar27 + 2 < lVar43));
            uVar12 = (int)lVar21 + iVar23 + 2;
          }
          uVar34 = (ulong)uVar12;
        } while ((int)uVar12 < iVar32);
      }
      local_f8 = local_f8 + 2;
      local_e0 = local_e0 + 2;
      local_f0 = local_f0 + 2;
      local_e8 = local_e8 + 2;
    } while ((int)local_f8 < (int)uVar17);
  }
  puVar7 = TTA::rtable_;
  uVar17 = 1;
  if (1 < TTA::length_) {
    uVar17 = 1;
    uVar29 = 1;
    do {
      if (uVar29 == puVar7[uVar29]) {
        uVar17 = uVar17 + 1;
        uVar12 = uVar17;
      }
      else {
        uVar12 = puVar7[puVar7[uVar29]];
      }
      puVar7[uVar29] = uVar12;
      uVar29 = uVar29 + 1;
    } while (uVar29 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar17;
  puVar7 = TTA::rtable_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar17 = *(uint *)&pMVar4->field_0x8;
  uVar15 = uVar17 & 0xfffffffe;
  uVar12 = *(uint *)&pMVar4->field_0xc;
  local_128 = uVar12 & 0x80000001;
  uVar34 = (long)(int)uVar12 & 0xfffffffffffffffe;
  uVar29 = 0;
  iVar32 = (int)uVar34;
  if (0 < (int)uVar15) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar28 = *(long *)&pMVar3->field_0x10;
    lVar35 = **(long **)&pMVar3->field_0x48;
    lVar5 = *(long *)&pMVar4->field_0x10;
    lVar36 = **(long **)&pMVar4->field_0x48;
    lVar43 = lVar5 + lVar36;
    lVar44 = lVar28 + 1 + lVar35;
    lVar38 = lVar28 + 1;
    uVar33 = 0;
    lVar25 = lVar5;
    do {
      puVar8 = TTA::rtable_;
      lVar42 = lVar36 * uVar33 + lVar5;
      lVar40 = lVar42 + lVar36;
      if (iVar32 < 1) {
        uVar22 = 0;
      }
      else {
        uVar22 = 0;
        do {
          lVar45 = (long)*(int *)(lVar25 + uVar22 * 4);
          if (lVar45 < 1) {
            *(undefined8 *)(lVar25 + uVar22 * 4) = 0;
            uVar18 = uVar22 + 1;
            *(undefined4 *)(lVar43 + uVar22 * 4) = 0;
            uVar30 = 0;
          }
          else {
            uVar24 = puVar8[lVar45];
            uVar41 = uVar24;
            if (*(char *)(lVar38 + -1 + uVar22) == '\0') {
              uVar41 = 0;
            }
            *(uint *)(lVar25 + uVar22 * 4) = uVar41;
            uVar18 = uVar22 | 1;
            uVar41 = uVar24;
            if (*(char *)(lVar38 + uVar22) == '\0') {
              uVar41 = 0;
            }
            *(uint *)(lVar25 + 4 + uVar22 * 4) = uVar41;
            uVar41 = uVar24;
            if (*(char *)(lVar44 + -1 + uVar22) == '\0') {
              uVar41 = 0;
            }
            *(uint *)(lVar43 + uVar22 * 4) = uVar41;
            uVar31 = (ulong)uVar24;
            if (*(char *)(lVar44 + uVar22) == '\0') {
              uVar31 = uVar29;
            }
            uVar30 = (undefined4)uVar31;
          }
          *(undefined4 *)(lVar40 + uVar18 * 4) = uVar30;
          uVar22 = uVar22 + 2;
        } while ((long)uVar22 < (long)uVar34);
      }
      if (local_128 == 1) {
        lVar45 = (long)*(int *)(lVar42 + uVar22 * 4);
        if (lVar45 < 1) {
          *(undefined4 *)(lVar42 + uVar22 * 4) = 0;
          *(undefined4 *)(lVar40 + uVar22 * 4) = 0;
        }
        else {
          lVar46 = lVar35 * uVar33 + lVar28;
          uVar24 = puVar7[lVar45];
          uVar18 = (ulong)uVar24;
          if (*(char *)(lVar46 + uVar22) == '\0') {
            uVar18 = uVar29;
          }
          *(int *)(lVar42 + uVar22 * 4) = (int)uVar18;
          if (*(char *)(lVar46 + lVar35 + uVar22) == '\0') {
            *(undefined4 *)(lVar40 + uVar22 * 4) = 0;
          }
          else {
            *(uint *)(lVar40 + uVar22 * 4) = uVar24;
          }
        }
      }
      uVar33 = uVar33 + 2;
      lVar43 = lVar43 + lVar36 * 2;
      lVar44 = lVar44 + lVar35 * 2;
      lVar38 = lVar38 + lVar35 * 2;
      lVar25 = lVar25 + lVar36 * 2;
    } while (uVar33 < uVar15);
    uVar29 = uVar33 & 0xffffffff;
  }
  puVar7 = TTA::rtable_;
  if ((uVar17 & 0x80000001) == 1) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar43 = *(long *)&pMVar3->field_0x10;
    lVar35 = **(long **)&pMVar3->field_0x48 * uVar29;
    lVar44 = *(long *)&pMVar4->field_0x10;
    lVar28 = uVar29 * **(long **)&pMVar4->field_0x48;
    if (iVar32 < 1) {
      uVar29 = 0;
    }
    else {
      lVar5 = lVar35 + lVar43;
      lVar36 = lVar28 + lVar44;
      uVar29 = 0;
      do {
        lVar25 = (long)*(int *)(lVar36 + uVar29 * 4);
        if (lVar25 < 1) {
          *(undefined8 *)(lVar36 + uVar29 * 4) = 0;
        }
        else {
          uVar17 = puVar7[lVar25];
          uVar15 = uVar17;
          if (*(char *)(lVar5 + uVar29) == '\0') {
            uVar15 = 0;
          }
          *(uint *)(lVar36 + uVar29 * 4) = uVar15;
          if (*(char *)(lVar5 + 1 + uVar29) == '\0') {
            *(undefined4 *)(lVar36 + 4 + uVar29 * 4) = 0;
          }
          else {
            *(uint *)(lVar36 + 4 + uVar29 * 4) = uVar17;
          }
        }
        uVar29 = uVar29 + 2;
      } while (uVar29 < ((long)(int)uVar12 & 0xfffffffeU));
    }
    if (local_128 == 1) {
      lVar44 = lVar44 + lVar28;
      lVar28 = (long)*(int *)(lVar44 + uVar29 * 4);
      uVar17 = 0;
      if ((0 < lVar28) && (uVar17 = 0, *(char *)(lVar43 + lVar35 + uVar29) != '\0')) {
        uVar17 = TTA::rtable_[lVar28];
      }
      *(uint *)(lVar44 + uVar29 * 4) = uVar17;
    }
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0);

        int w = img_labels_.cols;
        int h = img_labels_.rows;

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

        // Second scan (changed with better performing strategy to handle odd rows and columns)
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }